

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VWrmsNormMaskVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,N_Vector id,realtype *nrm)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  realtype rVar5;
  realtype local_68;
  realtype *idd;
  realtype *xd;
  realtype *wd;
  sunindextype N;
  sunindextype j;
  int i;
  realtype *nrm_local;
  N_Vector id_local;
  N_Vector *W_local;
  N_Vector *X_local;
  int nvec_local;
  
  if (nvec < 1) {
    X_local._4_4_ = -1;
  }
  else if (nvec == 1) {
    rVar5 = N_VWrmsNormMask_Serial(*X,*W,id);
    *nrm = rVar5;
    X_local._4_4_ = 0;
  }
  else {
    lVar1 = *(*X)->content;
    lVar2 = *(long *)((long)id->content + 0x10);
    for (j._4_4_ = 0; j._4_4_ < nvec; j._4_4_ = j._4_4_ + 1) {
      lVar3 = *(long *)((long)X[j._4_4_]->content + 0x10);
      lVar4 = *(long *)((long)W[j._4_4_]->content + 0x10);
      nrm[j._4_4_] = 0.0;
      for (N = 0; N < lVar1; N = N + 1) {
        if (0.0 < *(double *)(lVar2 + N * 8)) {
          nrm[j._4_4_] = *(double *)(lVar3 + N * 8) * *(double *)(lVar4 + N * 8) *
                         *(double *)(lVar3 + N * 8) * *(double *)(lVar4 + N * 8) + nrm[j._4_4_];
        }
      }
      if (0.0 < nrm[j._4_4_] / (double)lVar1) {
        local_68 = sqrt(nrm[j._4_4_] / (double)lVar1);
      }
      else {
        local_68 = 0.0;
      }
      nrm[j._4_4_] = local_68;
    }
    X_local._4_4_ = 0;
  }
  return X_local._4_4_;
}

Assistant:

int N_VWrmsNormMaskVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                      N_Vector id, realtype* nrm)
{
  int          i;
  sunindextype j, N;
  realtype*    wd=NULL;
  realtype*    xd=NULL;
  realtype*    idd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VWrmsNorm */
  if (nvec == 1) {
    nrm[0] = N_VWrmsNormMask_Serial(X[0], W[0], id);
    return(0);
  }

  /* get vector length and mask data array */
  N   = NV_LENGTH_S(X[0]);
  idd = NV_DATA_S(id);

  /* compute the WRMS norm for each vector in the vector array */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    wd = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j=0; j<N; j++) {
      if (idd[j] > ZERO)
        nrm[i] += SUNSQR(xd[j] * wd[j]);
    }
    nrm[i] = SUNRsqrt(nrm[i]/N);
  }

  return(0);
}